

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
BasicBufferCase(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                *this,Context *context,char *name,char *desc,int bufferSizeMin,int bufferSizeMax,
               int numSamples,int flags)

{
  deInt32 dVar1;
  deInt32 dVar2;
  reference pvVar3;
  float fVar4;
  deInt32 local_9c;
  int allocatedBufferSize;
  int bufferSize;
  int rawBufferSize;
  int sampleNdx;
  allocator<int> local_31;
  int local_30;
  int local_2c;
  int bufferSizeMax_local;
  int bufferSizeMin_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *this_local;
  
  local_30 = bufferSizeMax;
  local_2c = bufferSizeMin;
  _bufferSizeMax_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_015b2968;
  this->m_dummyProgram = (ShaderProgram *)0x0;
  this->m_dummyProgramPosLoc = -1;
  this->m_bufferID = 0;
  this->m_numSamples = numSamples;
  this->m_bufferSizeMin = local_2c;
  this->m_bufferSizeMax = local_30;
  this->m_allocateLargerBuffer = (bool)((byte)flags & 1);
  this->m_iteration = 0;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_iterationOrder,(long)numSamples,&local_31)
  ;
  std::allocator<int>::~allocator(&local_31);
  std::
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>
  ::allocator((allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>
               *)((long)&rawBufferSize + 3));
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ::vector(&this->m_results,(long)numSamples,
           (allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>
            *)((long)&rawBufferSize + 3));
  std::
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>
  ::~allocator((allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>
                *)((long)&rawBufferSize + 3));
  this->m_useGL = true;
  this->m_bufferRandomizerTimer = 0;
  generateTwoPassRandomIterationOrder(&this->m_iterationOrder,this->m_numSamples);
  for (bufferSize = 0; bufferSize < this->m_numSamples; bufferSize = bufferSize + 1) {
    fVar4 = ::deFloatFloor((float)(local_30 - local_2c) *
                           ((float)(bufferSize + 1) / (float)this->m_numSamples) + (float)local_2c);
    dVar1 = deAlign32((int)fVar4,0x10);
    local_9c = dVar1;
    if ((this->m_allocateLargerBuffer & 1U) != 0) {
      local_9c = (int)((float)dVar1 * 1.5);
    }
    dVar2 = deAlign32(local_9c,0x10);
    pvVar3 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             ::operator[](&this->m_results,(long)bufferSize);
    pvVar3->bufferSize = dVar1;
    pvVar3 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             ::operator[](&this->m_results,(long)bufferSize);
    pvVar3->allocatedSize = dVar2;
    pvVar3 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             ::operator[](&this->m_results,(long)bufferSize);
    pvVar3->writtenSize = -1;
  }
  return;
}

Assistant:

BasicBufferCase<SampleType>::BasicBufferCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, int numSamples, int flags)
	: TestCase					(context, tcu::NODETYPE_PERFORMANCE, name, desc)
	, m_dummyProgram			(DE_NULL)
	, m_dummyProgramPosLoc		(-1)
	, m_bufferID				(0)
	, m_numSamples				(numSamples)
	, m_bufferSizeMin			(bufferSizeMin)
	, m_bufferSizeMax			(bufferSizeMax)
	, m_allocateLargerBuffer	((flags & FLAG_ALLOCATE_LARGER_BUFFER) != 0)
	, m_iteration				(0)
	, m_iterationOrder			(numSamples)
	, m_results					(numSamples)
	, m_useGL					(true)
	, m_bufferRandomizerTimer	(0)
{
	// "randomize" iteration order. Deterministic, patternless
	generateTwoPassRandomIterationOrder(m_iterationOrder, m_numSamples);

	// choose buffer sizes
	for (int sampleNdx = 0; sampleNdx < m_numSamples; ++sampleNdx)
	{
		const int rawBufferSize			= (int)deFloatFloor((float)bufferSizeMin + (float)(bufferSizeMax - bufferSizeMin) * ((float)(sampleNdx + 1) / (float)m_numSamples));
		const int bufferSize			= deAlign32(rawBufferSize, 16);
		const int allocatedBufferSize	= deAlign32((m_allocateLargerBuffer) ? ((int)((float)bufferSize * 1.5f)) : (bufferSize), 16);

		m_results[sampleNdx].bufferSize		= bufferSize;
		m_results[sampleNdx].allocatedSize	= allocatedBufferSize;
		m_results[sampleNdx].writtenSize	= -1;
	}
}